

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Printer::Print
          (Printer *this,Message *message,ZeroCopyOutputStream *output)

{
  bool bVar1;
  TextGenerator *in_RDI;
  TextGenerator generator;
  TextGenerator *in_stack_000000c0;
  Message *in_stack_000000c8;
  Printer *in_stack_000000d0;
  TextGenerator *in_stack_ffffffffffffffb0;
  TextGenerator local_40;
  
  TextGenerator::TextGenerator
            (in_stack_ffffffffffffffb0,(ZeroCopyOutputStream *)&local_40,
             (int)((ulong)in_RDI >> 0x20));
  Print(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0);
  bVar1 = TextGenerator::failed(&local_40);
  TextGenerator::~TextGenerator(in_RDI);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool TextFormat::Printer::Print(const Message& message,
                                io::ZeroCopyOutputStream* output) const {
  TextGenerator generator(output, initial_indent_level_);

  Print(message, &generator);

  // Output false if the generator failed internally.
  return !generator.failed();
}